

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O3

Long amrex::VisMF::WriteOnlyHeader(FabArray<amrex::FArrayBox> *mf,string *mf_name,How how)

{
  Long LVar1;
  Version comm;
  FabOnDisk *fod;
  Header HStack_148;
  
  comm = currentVersion;
  Header::Header(&HStack_148,mf,how,currentVersion,false,ParallelDescriptor::m_comm);
  HStack_148.m_ncomp = 0;
  HStack_148.m_ngrow.vect[0] = 0;
  HStack_148.m_ngrow.vect[1] = 0;
  HStack_148.m_ngrow.vect[2] = 0;
  for (; HStack_148.m_fod.
         super_vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>.
         super__Vector_base<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>.
         _M_impl.super__Vector_impl_data._M_start !=
         HStack_148.m_fod.
         super_vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>.
         super__Vector_base<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>.
         _M_impl.super__Vector_impl_data._M_finish;
      HStack_148.m_fod.
      super_vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>.
      super__Vector_base<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>._M_impl.
      super__Vector_impl_data._M_start =
           HStack_148.m_fod.
           super_vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>.
           super__Vector_base<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>.
           _M_impl.super__Vector_impl_data._M_start + 1) {
    comm = 0x678284;
    std::__cxx11::string::_M_replace
              ((ulong)HStack_148.m_fod.
                      super_vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>
                      .
                      super__Vector_base<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>
                      ._M_impl.super__Vector_impl_data._M_start,0,
               (char *)((HStack_148.m_fod.
                         super_vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>
                         .
                         super__Vector_base<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_name)._M_string_length,
               0x678284);
    (HStack_148.m_fod.
     super_vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>.
     super__Vector_base<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>._M_impl.
     super__Vector_impl_data._M_start)->m_head = -1;
  }
  LVar1 = WriteHeader(mf_name,&HStack_148,0,comm);
  Header::~Header(&HStack_148);
  return LVar1;
}

Assistant:

Long
VisMF::WriteOnlyHeader (const FabArray<FArrayBox> & mf,
                        const std::string         & mf_name,
                        VisMF::How                  how)
{
//    BL_PROFILE("VisMF::WriteOnlyHeader(FabArray)");
    BL_ASSERT(mf_name[mf_name.length() - 1] != '/');
    BL_ASSERT(currentVersion != VisMF::Header::Undefined_v1);


    Long bytesWritten(0);

    // Construct header for empty MultiFab
    bool calcMinMax(false);
    VisMF::Header hdr(mf, how, currentVersion, calcMinMax);

    // We are saving NO data => nComp = 0, nGrow = {0, 0, 0}
    hdr.m_ncomp = 0;
    hdr.m_ngrow = IntVect{AMREX_D_DECL(0, 0, 0)};

    // FabOnDisk list is uninitialized => initialize it here
    for(VisMF::FabOnDisk & fod : hdr.m_fod){
        fod.m_name = "Not Saved";
        fod.m_head = -1;
    }

    // Write header on the IOProcessorNumber
    int coordinatorProc(ParallelDescriptor::IOProcessorNumber());
    bytesWritten += VisMF::WriteHeader(mf_name, hdr, coordinatorProc);

    return bytesWritten;
}